

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O0

Location * __thiscall
trieste::Location::operator*(Location *__return_storage_ptr__,Location *this,Location *that)

{
  bool bVar1;
  unsigned_long *puVar2;
  shared_ptr<trieste::SourceDef> local_50;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  unsigned_long hi;
  unsigned_long lo;
  Location *that_local;
  Location *this_local;
  
  lo = (unsigned_long)that;
  that_local = this;
  this_local = __return_storage_ptr__;
  bVar1 = std::operator==(&this->source,&that->source);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    puVar2 = CLI::std::min<unsigned_long>(&this->pos,(unsigned_long *)(lo + 0x10));
    hi = *puVar2;
    local_38 = this->pos + this->len;
    local_40 = *(long *)(lo + 0x10) + *(long *)(lo + 0x18);
    puVar2 = CLI::std::max<unsigned_long>(&local_38,&local_40);
    local_30 = *puVar2;
    CLI::std::shared_ptr<trieste::SourceDef>::shared_ptr(&local_50,&this->source);
    Location(__return_storage_ptr__,&local_50,hi,local_30 - hi);
    CLI::std::shared_ptr<trieste::SourceDef>::~shared_ptr(&local_50);
  }
  else {
    Location(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Location operator*(const Location& that) const
    {
      if (source != that.source)
        return *this;

      auto lo = std::min(pos, that.pos);
      auto hi = std::max(pos + len, that.pos + that.len);
      return {source, lo, hi - lo};
    }